

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildRecursive
          (BVHAggregate *this,
          vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
          *threadAllocators,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,int start,
          int end,atomic<int> *totalNodes,atomic<int> *orderedPrimsOffset,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  SplitMethod SVar4;
  pointer pPVar5;
  pointer pPVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  size_t sVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined8 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined4 uVar103;
  undefined4 uVar104;
  undefined4 uVar105;
  BVHPrimitive __value;
  BVHPrimitive __value_00;
  BVHPrimitive __value_01;
  BVHPrimitive __value_02;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined8 uVar112;
  undefined4 uVar113;
  undefined1 auVar114 [12];
  undefined8 uVar115;
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined8 uVar118;
  undefined1 auVar119 [12];
  undefined1 auVar120 [12];
  undefined8 uVar121;
  undefined1 auVar122 [12];
  undefined1 auVar123 [12];
  undefined8 uVar124;
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  size_t *psVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  atomic<int> *orderedPrimsOffset_00;
  BVHAggregate *this_00;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  *threadAllocators_00;
  atomic<int> *totalNodes_00;
  pointer pBVar134;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:257:34)>
  __comp;
  int *piVar135;
  BVHBuildNode *pBVar136;
  float *pfVar137;
  pointer pBVar138;
  undefined8 uVar139;
  pointer pBVar140;
  pointer pBVar141;
  BVHBuildNode *c1;
  ulong uVar142;
  pointer pBVar143;
  pointer pBVar144;
  int iVar145;
  BVHPrimitive *__i;
  Bounds3<float> *pBVar146;
  long lVar147;
  int iVar148;
  pointer pBVar149;
  int iVar150;
  Point3f *pPVar151;
  long lVar152;
  long lVar153;
  Bounds3f *pBVar154;
  int i;
  BVHPrimitive *pBVar155;
  BVHBuildNode *this_01;
  ulong uVar156;
  BVHPrimitive *pBVar157;
  float *pfVar158;
  bool bVar159;
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  float fVar162;
  undefined1 auVar163 [64];
  undefined1 auVar164 [56];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [60];
  Vector3<float> VVar168;
  Bounds3<float> *local_520;
  int end_local;
  int start_local;
  pointer local_508;
  int local_4fc;
  pointer local_4f8;
  BVHAggregate *local_4f0;
  anon_class_4_1_ba1d3fe8 local_4e4;
  float local_4e0;
  int local_4dc;
  undefined1 local_4d8 [8];
  undefined1 auStack_4d0 [28];
  float local_4b4;
  float local_4b0;
  float local_4ac;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  *local_4a8;
  atomic<int> *totalNodes_local;
  BVHBuildNode *children [2];
  float fStack_488;
  float afStack_484 [6];
  undefined4 uStack_46c;
  Bounds3<float> local_37c;
  int local_364;
  Bounds3<float> local_360;
  Bounds3<float> local_348;
  Bounds3<float> local_328;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  _Any_data local_2f8;
  code *pcStack_2e8;
  code *pcStack_2e0;
  Allocator alloc;
  int countAbove [11];
  int countBelow [11];
  anon_class_32_3_58f29f95 local_268;
  Bounds3f boundsAbove [11];
  Bounds3f boundsBelow [11];
  
  end_local = end;
  start_local = start;
  local_4f0 = this;
  totalNodes_local = totalNodes;
  piVar135 = (int *)ThreadIndex();
  alloc.memoryResource =
       (threadAllocators->
       super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
       )._M_impl.super__Vector_impl_data._M_start[*piVar135].memoryResource;
  local_4a8 = threadAllocators;
  pBVar136 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::BVHBuildNode>(&alloc);
  iVar150 = start_local;
  iVar148 = end_local;
  LOCK();
  (totalNodes->super___atomic_base<int>)._M_i = (totalNodes->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  auVar165._8_4_ = 0xff7fffff;
  auVar165._0_8_ = 0xff7fffffff7fffff;
  auVar165._12_4_ = 0xff7fffff;
  lVar152 = (long)start_local;
  lVar147 = (long)end_local;
  local_508 = (pointer)(lVar152 * 0x30);
  local_348.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  local_348.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  local_348.pMin.super_Tuple3<pbrt::Point3,_float>.z = 3.4028235e+38;
  local_348.pMax.super_Tuple3<pbrt::Point3,_float>.x = -3.4028235e+38;
  pBVar154 = &local_508->bounds;
  local_348.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ = vmovlps_avx(auVar165);
  for (lVar153 = lVar152; lVar153 < lVar147; lVar153 = lVar153 + 1) {
    Union<float>((Bounds3<float> *)children,&local_348,
                 (Bounds3<float> *)
                 ((long)&(pBVar154->pMin).super_Tuple3<pbrt::Point3,_float>.x +
                 (long)(bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start));
    local_348.pMin.super_Tuple3<pbrt::Point3,_float>.y = children[0]._4_4_;
    local_348.pMin.super_Tuple3<pbrt::Point3,_float>.x = children[0]._0_4_;
    local_348.pMax.super_Tuple3<pbrt::Point3,_float>.x = children[1]._4_4_;
    local_348.pMin.super_Tuple3<pbrt::Point3,_float>.z = children[1]._0_4_;
    local_348.pMax.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[0];
    local_348.pMax.super_Tuple3<pbrt::Point3,_float>.y = fStack_488;
    pBVar154 = pBVar154 + 2;
  }
  iVar145 = iVar148 - iVar150;
  fVar162 = Bounds3<float>::SurfaceArea(&local_348);
  if (((fVar162 == 0.0) && (!NAN(fVar162))) || (iVar145 == 1)) {
    LOCK();
    iVar148 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + iVar145;
    UNLOCK();
    lVar153 = (long)start_local;
    pPVar5 = (orderedPrims->
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pBVar138 = (bvhPrimitives->
               super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar153;
    pPVar6 = (local_4f0->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar150 = iVar148;
    for (; lVar153 < end_local; lVar153 = lVar153 + 1) {
      psVar127 = &pBVar138->primitiveIndex;
      pBVar138 = pBVar138 + 1;
      pPVar5[iVar150].
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      .bits = pPVar6[(int)*psVar127].
              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
              .bits;
      iVar150 = iVar150 + 1;
    }
LAB_003d8537:
    BVHBuildNode::InitLeaf(pBVar136,iVar148,iVar145,&local_348);
    return pBVar136;
  }
  auVar166._8_4_ = 0xff7fffff;
  auVar166._0_8_ = 0xff7fffffff7fffff;
  auVar166._12_4_ = 0xff7fffff;
  local_4f8 = (pointer)CONCAT44(local_4f8._4_4_,iVar145);
  pfVar158 = (float *)(auStack_4d0 + 0xc);
  pBVar146 = (Bounds3<float> *)local_4d8;
  pPVar151 = &local_508->centroid;
  local_4d8._0_4_ = 3.4028235e+38;
  local_4d8._4_4_ = 3.4028235e+38;
  auStack_4d0._0_4_ = 3.4028235e+38;
  auStack_4d0._4_4_ = -3.4028235e+38;
  auStack_4d0._8_8_ = vmovlps_avx(auVar166);
  auStack_4d0._16_8_ = pBVar136;
  for (lVar153 = lVar152; lVar153 < lVar147; lVar153 = lVar153 + 1) {
    Union<float>((Bounds3<float> *)children,pBVar146,
                 (Point3<float> *)
                 ((long)&(pPVar151->super_Tuple3<pbrt::Point3,_float>).x +
                 (long)(bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start));
    local_4d8._4_4_ = children[0]._4_4_;
    local_4d8._0_4_ = children[0]._0_4_;
    auStack_4d0._4_4_ = children[1]._4_4_;
    auStack_4d0._0_4_ = children[1]._0_4_;
    auStack_4d0._12_4_ = afStack_484[0];
    auStack_4d0._8_4_ = fStack_488;
    pPVar151 = pPVar151 + 4;
  }
  __comp._M_comp.dim = (anon_class_4_1_ba1d3fe8)Bounds3<float>::MaxDimension(pBVar146);
  iVar145 = (iVar150 + iVar148) / 2;
  pfVar137 = (float *)(auStack_4d0 + 4);
  if (__comp._M_comp.dim != 0) {
    pBVar146 = (Bounds3<float> *)(local_4d8 + 4);
    pfVar137 = (float *)(auStack_4d0 + 8);
    if (__comp._M_comp.dim != 1) {
      pBVar146 = (Bounds3<float> *)auStack_4d0;
      pfVar137 = pfVar158;
    }
  }
  fVar162 = (pBVar146->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  local_4fc = iVar145;
  if ((*pfVar137 == fVar162) && (!NAN(*pfVar137) && !NAN(fVar162))) {
    LOCK();
    iVar148 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + (int)local_4f8;
    UNLOCK();
    lVar153 = (long)start_local;
    pPVar5 = (orderedPrims->
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pBVar138 = (bvhPrimitives->
               super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar153;
    pPVar6 = (local_4f0->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar150 = iVar148;
    for (; pBVar136 = (BVHBuildNode *)auStack_4d0._16_8_, iVar145 = (int)local_4f8,
        lVar153 < end_local; lVar153 = lVar153 + 1) {
      psVar127 = &pBVar138->primitiveIndex;
      pBVar138 = pBVar138 + 1;
      pPVar5[iVar150].
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      .bits = pPVar6[(int)*psVar127].
              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
              .bits;
      iVar150 = iVar150 + 1;
    }
    goto LAB_003d8537;
  }
  SVar4 = local_4f0->splitMethod;
  if (SVar4 == Middle) {
    if (__comp._M_comp.dim == 1) {
      pfVar158 = (float *)(auStack_4d0 + 8);
      fVar162 = (float)local_4d8._4_4_;
    }
    else if (__comp._M_comp.dim == 0) {
      pfVar158 = (float *)(auStack_4d0 + 4);
      fVar162 = (float)local_4d8._0_4_;
    }
    else {
      fVar162 = (float)auStack_4d0._0_4_;
    }
    fVar162 = (fVar162 + *pfVar158) * 0.5;
    pBVar138 = (bvhPrimitives->
               super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
               super__Vector_impl_data._M_start;
    pBVar141 = pBVar138 + lVar147;
    for (pBVar138 = (pointer)((long)&local_508->primitiveIndex + (long)pBVar138);
        pBVar140 = pBVar141, pBVar138 != pBVar141; pBVar138 = pBVar138 + 1) {
      if (__comp._M_comp.dim == 0) {
        pPVar151 = &pBVar138->centroid;
      }
      else if (__comp._M_comp.dim == 1) {
        pPVar151 = (Point3f *)&(pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.y;
      }
      else {
        pPVar151 = (Point3f *)&(pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.z;
      }
      if (fVar162 <= (pPVar151->super_Tuple3<pbrt::Point3,_float>).x) {
        do {
          pBVar143 = pBVar141;
          pBVar141 = pBVar143 + -1;
          pBVar140 = pBVar138;
          if (pBVar141 == pBVar138) goto LAB_003d7f5f;
          if (__comp._M_comp.dim == 0) {
            pPVar151 = &pBVar143[-1].centroid;
          }
          else if (__comp._M_comp.dim == 1) {
            pPVar151 = (Point3f *)&pBVar143[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
          }
          else {
            pPVar151 = (Point3f *)&pBVar143[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
          }
        } while (fVar162 <= (pPVar151->super_Tuple3<pbrt::Point3,_float>).x);
        uVar139 = *(undefined8 *)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
        uVar112 = pBVar138->primitiveIndex;
        uVar113 = (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        auVar106._8_4_ = uVar113;
        auVar106._0_8_ = uVar112;
        uVar14 = *(undefined8 *)
                  ((long)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float> + 8);
        uVar16 = *(undefined8 *)
                  ((long)&(pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float> + 4);
        uVar37 = (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.x;
        uVar38 = (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        uVar39 = *(undefined8 *)&(pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar39;
        uStack_46c = (undefined4)((ulong)uVar39 >> 0x20);
        children[0]._0_4_ = (float)pBVar138->primitiveIndex;
        children[0]._4_4_ = (float)(pBVar138->primitiveIndex >> 0x20);
        children[1]._0_4_ = (float)uVar139;
        children[1]._4_4_ = (float)((ulong)uVar139 >> 0x20);
        fStack_488 = (float)uVar14;
        afStack_484[0] = (float)((ulong)uVar14 >> 0x20);
        afStack_484[1] = (float)uVar16;
        afStack_484[2] = (float)((ulong)uVar16 >> 0x20);
        sVar7 = pBVar141->primitiveIndex;
        uVar139 = *(undefined8 *)&pBVar143[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
        uVar14 = *(undefined8 *)
                  ((long)&pBVar143[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float> + 8);
        uVar16 = *(undefined8 *)
                  ((long)&pBVar143[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float> + 4);
        fVar2 = pBVar143[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = pBVar143[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar39 = *(undefined8 *)
                  ((long)&pBVar143[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float> + 8);
        fVar128 = pBVar143[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = pBVar143[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
        *(undefined8 *)((long)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float> + 4) =
             *(undefined8 *)((long)&pBVar143[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float> + 4);
        (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)((long)&(pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float> + 8) =
             uVar39;
        (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar138->primitiveIndex = sVar7;
        *(undefined8 *)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float> = uVar139;
        *(undefined8 *)((long)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float> + 8) =
             uVar14;
        *(undefined8 *)((long)&(pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float> + 4) =
             uVar16;
        auVar106._12_4_ = children[1]._4_4_;
        auVar106._16_4_ = fStack_488;
        auVar106._20_4_ = afStack_484[0];
        auVar106._24_4_ = afStack_484[1];
        auVar106._28_4_ = afStack_484[2];
        auVar107._4_4_ = fStack_488;
        auVar107._0_4_ = children[1]._4_4_;
        auVar107._8_4_ = afStack_484[0];
        auVar107._12_4_ = afStack_484[1];
        auVar107._16_4_ = afStack_484[2];
        auVar107._20_4_ = uVar37;
        auVar107._24_4_ = uVar38;
        auVar107._28_4_ = afStack_484[5];
        *(undefined1 (*) [32])
         ((long)&pBVar143[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float> + 4) = auVar107;
        pBVar141->primitiveIndex = uVar112;
        (pBVar141->bounds).pMin = (Point3<float>)SUB2412(auVar106._8_24_,0);
        (pBVar141->bounds).pMax = (Point3<float>)SUB2412(auVar106._8_24_,0xc);
        afStack_484[3] = (float)uVar37;
        afStack_484[4] = (float)uVar38;
      }
    }
LAB_003d7f5f:
    pBVar138 = (bvhPrimitives->
               super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_4fc = (int)(((long)pBVar140 - (long)pBVar138) / 0x30);
    if (iVar150 != local_4fc && iVar148 != local_4fc) goto LAB_003d86b8;
  }
  else {
    if (SVar4 != EqualCounts) {
      if ((int)local_4f8 < 3) {
        if (iVar145 != iVar148 && iVar148 != iVar150) {
          pBVar138 = (bvhPrimitives->
                     super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          pBVar141 = pBVar138 + iVar145;
          pBVar155 = (BVHPrimitive *)((long)&local_508->primitiveIndex + (long)pBVar138);
          uVar142 = (ulong)(uint)((int)LZCOUNT((lVar147 * 0x30 - (long)local_508) / 0x30) * 2) ^
                    0x7e;
          lVar153 = (ulong)(__comp._M_comp.dim != 1) * 4 + 0x24;
          pBVar138 = pBVar138 + lVar147;
          if (__comp._M_comp.dim == 0) {
            lVar153 = 0x20;
          }
          while (pBVar140 = pBVar138, 0x90 < (long)pBVar140 - (long)pBVar155) {
            bVar159 = uVar142 == 0;
            uVar142 = uVar142 - 1;
            if (bVar159) {
              pBVar138 = pBVar141 + 1;
              lVar152 = ((long)pBVar138 - (long)pBVar155) / 0x30;
              local_508 = pBVar141;
              local_4f8 = pBVar140;
              if (0x5f < (long)pBVar138 - (long)pBVar155) {
                uVar142 = lVar152 - 2U >> 1;
                pBVar157 = pBVar155 + uVar142;
                do {
                  uVar118 = pBVar157->primitiveIndex;
                  auVar119 = *(undefined1 (*) [12])&(pBVar157->bounds).pMin;
                  auVar120 = *(undefined1 (*) [12])&(pBVar157->bounds).pMax;
                  __value_01.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                       (Tuple3<pbrt::Point3,_float>)auVar120;
                  __value_01.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                       (Tuple3<pbrt::Point3,_float>)auVar119;
                  __value_01.primitiveIndex = uVar118;
                  __value_01._32_16_ =
                       SUB3216(*(undefined1 (*) [32])
                                &(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z,0x10);
                  std::
                  __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                            (pBVar155,uVar142,lVar152,__value_01,
                             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:271:38)>
                              )__comp._M_comp.dim);
                  pBVar157 = pBVar157 + -1;
                  bVar159 = uVar142 != 0;
                  uVar142 = uVar142 - 1;
                  pBVar140 = local_4f8;
                } while (bVar159);
              }
              for (; pBVar138 < pBVar140; pBVar138 = pBVar138 + 1) {
                if (*(float *)((long)&pBVar138->primitiveIndex + lVar153) <
                    *(float *)((long)&pBVar155->primitiveIndex + lVar153)) {
                  uVar94 = (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  uVar95 = (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  pfVar158 = &(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar96 = (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar97 = (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar124 = pBVar138->primitiveIndex;
                  auVar125 = *(undefined1 (*) [12])&(pBVar138->bounds).pMin;
                  auVar126 = *(undefined1 (*) [12])&(pBVar138->bounds).pMax;
                  __value_02.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                       (Tuple3<pbrt::Point3,_float>)auVar126;
                  __value_02.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                       (Tuple3<pbrt::Point3,_float>)auVar125;
                  __value_02.primitiveIndex = uVar124;
                  auVar114 = *(undefined1 (*) [12])pfVar158;
                  uVar98 = (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar99 = (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  uVar139 = *(undefined8 *)&(pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.z
                  ;
                  afStack_484[5] = (float)uVar139;
                  uStack_46c = (undefined4)((ulong)uVar139 >> 0x20);
                  children[0]._0_4_ = (float)pBVar138->primitiveIndex;
                  children[0]._4_4_ = (float)(pBVar138->primitiveIndex >> 0x20);
                  afStack_484[0] = (float)((ulong)*(undefined8 *)pfVar158 >> 0x20);
                  sVar7 = pBVar155->primitiveIndex;
                  fVar130 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar131 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar139 = *(undefined8 *)
                             &(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar132 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar133 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar162 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar2 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar3 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar14 = *(undefined8 *)
                            &(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar128 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  fVar129 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                       (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
                  (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
                  (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
                  *(undefined8 *)&(pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar14;
                  (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
                  (pBVar138->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
                  pBVar138->primitiveIndex = sVar7;
                  (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
                  (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
                  *(undefined8 *)&(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar139;
                  (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
                  (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
                  auVar109._12_4_ = uVar97;
                  auVar109._0_12_ = auVar114;
                  auVar109._16_4_ = uVar98;
                  auVar109._20_4_ = uVar99;
                  auVar109._24_4_ = afStack_484[5];
                  auVar109._28_4_ = uStack_46c;
                  __value_02._32_16_ = auVar109._16_16_;
                  children[1]._0_4_ = (float)uVar94;
                  children[1]._4_4_ = (float)uVar95;
                  afStack_484[1] = (float)uVar96;
                  afStack_484[2] = (float)uVar97;
                  afStack_484[3] = (float)uVar98;
                  afStack_484[4] = (float)uVar99;
                  std::
                  __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                            (pBVar155,0,lVar152,__value_02,
                             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:271:38)>
                              )__comp._M_comp.dim);
                }
              }
              goto LAB_003d8667;
            }
            fVar162 = *(float *)((long)&pBVar155[1].primitiveIndex + lVar153);
            fVar2 = *(float *)((long)&pBVar140[-1].primitiveIndex + lVar153);
            pBVar138 = pBVar155 + 1;
            pBVar157 = pBVar155 + (ulong)((long)pBVar140 - (long)pBVar155) / 0x60;
            fVar3 = *(float *)((long)&pBVar157->primitiveIndex + lVar153);
            pBVar143 = pBVar140;
            if (fVar3 <= fVar162) {
              if (fVar2 <= fVar162) {
                if (fVar3 < fVar2) goto LAB_003d77a7;
                goto LAB_003d77f5;
              }
LAB_003d7750:
              sVar7 = pBVar155->primitiveIndex;
              uVar8 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
              uVar9 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              uVar10 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar11 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              uVar12 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
              uVar13 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              afStack_484[5] = (float)uVar14;
              uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
              children[0]._0_4_ = (float)sVar7;
              children[0]._4_4_ = (float)(sVar7 >> 0x20);
              fStack_488 = (float)uVar139;
              afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
              sVar15 = pBVar138->primitiveIndex;
              fVar130 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
              fVar131 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar132 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              fVar133 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar162 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar2 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
              fVar3 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar16 = *(undefined8 *)&pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar128 = pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              fVar129 = pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
              *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
              pBVar155->primitiveIndex = sVar15;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
              *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
              uVar14 = CONCAT44(uVar12,uVar11);
              pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar9;
              pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
              pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
              pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar10;
              *(undefined8 *)&pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar13;
              pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
              pBVar138->primitiveIndex = sVar7;
              pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar8;
              pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar9;
              *(undefined8 *)&pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
              pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar10;
              pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar11;
              children[1]._0_4_ = (float)uVar8;
              children[1]._4_4_ = (float)uVar9;
              afStack_484[1] = (float)uVar10;
              afStack_484[2] = (float)uVar11;
              afStack_484[3] = (float)uVar12;
              afStack_484[4] = (float)uVar13;
            }
            else if (fVar3 < fVar2) {
LAB_003d77f5:
              sVar7 = pBVar155->primitiveIndex;
              uVar23 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
              uVar24 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              uVar25 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar26 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              uVar27 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
              uVar28 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              afStack_484[5] = (float)uVar14;
              uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
              children[0]._0_4_ = (float)sVar7;
              children[0]._4_4_ = (float)(sVar7 >> 0x20);
              fStack_488 = (float)uVar139;
              afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
              sVar15 = pBVar157->primitiveIndex;
              fVar130 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
              fVar131 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar132 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              fVar133 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar162 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar2 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
              fVar3 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar16 = *(undefined8 *)&(pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar128 = (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              fVar129 = (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
              *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
              pBVar155->primitiveIndex = sVar15;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
              *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
              uVar14 = CONCAT44(uVar27,uVar26);
              (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar24;
              (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
              (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
              (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar25;
              *(undefined8 *)&(pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar28;
              (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
              pBVar157->primitiveIndex = sVar7;
              (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar23;
              (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar24;
              *(undefined8 *)&(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
              (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar25;
              (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar26;
              children[1]._0_4_ = (float)uVar23;
              children[1]._4_4_ = (float)uVar24;
              afStack_484[1] = (float)uVar25;
              afStack_484[2] = (float)uVar26;
              afStack_484[3] = (float)uVar27;
              afStack_484[4] = (float)uVar28;
            }
            else {
              if (fVar2 <= fVar162) goto LAB_003d7750;
LAB_003d77a7:
              sVar7 = pBVar155->primitiveIndex;
              uVar17 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
              uVar18 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              uVar19 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar20 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              uVar21 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
              uVar22 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              afStack_484[5] = (float)uVar14;
              uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
              children[0]._0_4_ = (float)sVar7;
              children[0]._4_4_ = (float)(sVar7 >> 0x20);
              fStack_488 = (float)uVar139;
              afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
              sVar15 = pBVar140[-1].primitiveIndex;
              fVar130 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
              fVar131 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar132 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              fVar133 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar162 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar2 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
              fVar3 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar16 = *(undefined8 *)&pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar128 = pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              fVar129 = pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
              *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
              (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
              pBVar155->primitiveIndex = sVar15;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
              (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
              *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
              (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
              uVar14 = CONCAT44(uVar21,uVar20);
              pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar18;
              pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
              pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
              pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar19;
              *(undefined8 *)&pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar22;
              pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
              pBVar140[-1].primitiveIndex = sVar7;
              pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar17;
              pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar18;
              *(undefined8 *)&pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139
              ;
              pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar19;
              pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar20;
              children[1]._0_4_ = (float)uVar17;
              children[1]._4_4_ = (float)uVar18;
              afStack_484[1] = (float)uVar19;
              afStack_484[2] = (float)uVar20;
              afStack_484[3] = (float)uVar21;
              afStack_484[4] = (float)uVar22;
            }
            while( true ) {
              fVar162 = *(float *)((long)&pBVar155->primitiveIndex + lVar153);
              pBVar134 = pBVar138 + -1;
              do {
                pBVar149 = pBVar134;
                pBVar134 = pBVar149 + 1;
              } while (*(float *)((long)&pBVar149[1].primitiveIndex + lVar153) < fVar162);
              pBVar138 = pBVar149 + 2;
              do {
                pBVar144 = pBVar143;
                pBVar143 = pBVar144 + -1;
              } while (fVar162 < *(float *)((long)&pBVar144[-1].primitiveIndex + lVar153));
              if (pBVar143 <= pBVar134) break;
              sVar7 = pBVar134->primitiveIndex;
              uVar29 = pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
              uVar30 = pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar139 = *(undefined8 *)&pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              uVar31 = pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar32 = pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              uVar33 = pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
              uVar34 = pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              afStack_484[5] = (float)uVar14;
              uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
              children[0]._0_4_ = (float)sVar7;
              children[0]._4_4_ = (float)(sVar7 >> 0x20);
              fStack_488 = (float)uVar139;
              afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
              sVar15 = pBVar143->primitiveIndex;
              fVar130 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
              fVar131 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              uVar14 = *(undefined8 *)&pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar132 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              fVar133 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar162 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar2 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
              fVar3 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar16 = *(undefined8 *)&pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar128 = pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              fVar129 = pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
              pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
              pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
              *(undefined8 *)&pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
              pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar128;
              pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar129;
              pBVar134->primitiveIndex = sVar15;
              pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
              pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
              *(undefined8 *)&pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
              pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
              uVar14 = CONCAT44(uVar33,uVar32);
              pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar30;
              pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
              pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
              pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar31;
              *(undefined8 *)&pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
              pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar34;
              pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
              pBVar143->primitiveIndex = sVar7;
              pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
              pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar30;
              *(undefined8 *)&pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139
              ;
              pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar31;
              pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar32;
              children[1]._0_4_ = (float)uVar29;
              children[1]._4_4_ = (float)uVar30;
              afStack_484[1] = (float)uVar31;
              afStack_484[2] = (float)uVar32;
              afStack_484[3] = (float)uVar33;
              afStack_484[4] = (float)uVar34;
            }
            pBVar138 = pBVar134;
            if (pBVar134 <= pBVar141) {
              pBVar138 = pBVar140;
              pBVar155 = pBVar134;
            }
          }
          pBVar138 = pBVar155;
          if (pBVar155 != pBVar140) {
            while (pBVar141 = pBVar138 + 1, pBVar141 != pBVar140) {
              if (*(float *)((long)&pBVar155->primitiveIndex + lVar153) <=
                  *(float *)((long)&pBVar141->primitiveIndex + lVar153)) {
                sVar7 = pBVar141->primitiveIndex;
                uVar88 = pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar89 = pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar139 = *(undefined8 *)
                           &pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar90 = pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar91 = pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar92 = pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                uVar93 = pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                uVar14 = *(undefined8 *)&pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                afStack_484[3] = (float)uVar92;
                afStack_484[4] = (float)uVar93;
                afStack_484[5] = (float)uVar14;
                uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
                children[0]._0_4_ = (float)sVar7;
                children[0]._4_4_ = (float)(sVar7 >> 0x20);
                children[1]._0_4_ = (float)uVar88;
                children[1]._4_4_ = (float)uVar89;
                fStack_488 = (float)uVar139;
                afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
                afStack_484[1] = (float)uVar90;
                afStack_484[2] = (float)uVar91;
                fVar162 = *(float *)((long)children + lVar153);
                for (; fVar162 < *(float *)((long)&pBVar138->primitiveIndex + lVar153);
                    pBVar138 = pBVar138 + -1) {
                  sVar15 = pBVar138->primitiveIndex;
                  fVar2 = (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar3 = (pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar14 = *(undefined8 *)
                            &(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar128 = (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar129 = (pBVar138->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  *(undefined1 (*) [32])&pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y
                       = *(undefined1 (*) [32])
                          &(pBVar138->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  pBVar138[1].primitiveIndex = sVar15;
                  pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
                  pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
                  *(undefined8 *)&pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar14;
                  pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar128;
                  pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar129;
                }
                pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar89;
                pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
                pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
                pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar90;
                *(ulong *)&pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(afStack_484[3],afStack_484[2]);
                pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar93;
                pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
                pBVar138[1].primitiveIndex = sVar7;
                pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar88;
                pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar89;
                *(undefined8 *)&pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     uVar139;
                pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar90;
                pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar91;
                pBVar138 = pBVar141;
              }
              else {
                uVar82 = pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar83 = pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar139 = *(undefined8 *)
                           &pBVar138[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar84 = pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar85 = pBVar138[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar86 = pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                uVar87 = pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                uVar14 = *(undefined8 *)&pBVar138[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                afStack_484[5] = (float)uVar14;
                uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
                children[0]._0_4_ = (float)pBVar141->primitiveIndex;
                children[0]._4_4_ = (float)(pBVar141->primitiveIndex >> 0x20);
                fStack_488 = (float)uVar139;
                afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
                children[1]._0_4_ = (float)uVar82;
                children[1]._4_4_ = (float)uVar83;
                afStack_484[1] = (float)uVar84;
                afStack_484[2] = (float)uVar85;
                afStack_484[3] = (float)uVar86;
                afStack_484[4] = (float)uVar87;
                memmove(pBVar138 + ((long)pBVar141 - (long)pBVar155) / -0x30 + 2,pBVar155,
                        (long)pBVar141 - (long)pBVar155);
                pBVar155->primitiveIndex = CONCAT44(children[0]._4_4_,children[0]._0_4_);
                (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = children[1]._0_4_;
                (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = children[1]._4_4_;
                *(ulong *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(afStack_484[0],fStack_488);
                (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = afStack_484[1];
                (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[2];
                (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = children[1]._4_4_;
                (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
                (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
                (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = afStack_484[1];
                *(ulong *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(afStack_484[3],afStack_484[2]);
                (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = afStack_484[4];
                (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
                pBVar138 = pBVar141;
              }
            }
          }
        }
      }
      else {
        auVar160 = vpmovsxwd_avx512f(_DAT_028b2c20);
        auVar161 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
        uVar139 = CONCAT62((uint6)(ushort)(SVar4 >> 0x10),0xfff);
        auVar163 = ZEXT1264(ZEXT812(0));
        local_520 = boundsBelow;
        vpscatterdd_avx512f(ZEXT864(children) + auVar160,uVar139,auVar163);
        vscatterdps_avx512f(ZEXT864((long)children + 4) + auVar160,uVar139,auVar161);
        vscatterdps_avx512f(ZEXT864(children) + _DAT_028b25c0,uVar139,auVar161);
        vscatterdps_avx512f(ZEXT864(children) + _DAT_028b2600,uVar139,auVar161);
        auVar160 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
        vscatterdps_avx512f(ZEXT864(children) + _DAT_028b2640,uVar139,auVar160);
        vscatterdps_avx512f(ZEXT864(children) + _DAT_028b2680,uVar139,auVar160);
        vscatterdps_avx512f(ZEXT864(children) + _DAT_028b26c0,uVar139,auVar160);
        pPVar151 = &local_508->centroid;
        pBVar138 = local_508;
        for (; lVar152 < lVar147; lVar152 = lVar152 + 1) {
          auVar164 = ZEXT856(auVar163._8_8_);
          auVar167 = ZEXT1260(auVar160._4_12_);
          VVar168 = Bounds3<float>::Offset
                              ((Bounds3<float> *)local_4d8,
                               (Point3<float> *)
                               ((long)&(pPVar151->super_Tuple3<pbrt::Point3,_float>).x +
                               (long)(bvhPrimitives->
                                     super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                     )._M_impl.super__Vector_impl_data._M_start));
          auVar160._0_4_ = VVar168.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar160._4_60_ = auVar167;
          auVar161._0_8_ = VVar168.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar161._8_56_ = auVar164;
          if (__comp._M_comp.dim != 0) {
            if (__comp._M_comp.dim == 1) {
              auVar165 = vmovshdup_avx(auVar161._0_16_);
              auVar161 = ZEXT1664(auVar165);
            }
            else {
              auVar161 = ZEXT1664(auVar160._0_16_);
            }
          }
          iVar150 = (int)(auVar161._0_4_ * 12.0);
          iVar148 = 0xb;
          if (iVar150 != 0xc) {
            iVar148 = iVar150;
          }
          lVar153 = (long)iVar148 * 0x1c;
          pBVar146 = (Bounds3<float> *)((long)children + lVar153 + 4);
          piVar135 = (int *)((long)children + lVar153);
          *piVar135 = *piVar135 + 1;
          Union<float>(local_520,pBVar146,
                       (Bounds3<float> *)
                       ((long)&(((Bounds3f *)(pPVar151 + -2))->pMin).
                               super_Tuple3<pbrt::Point3,_float>.x +
                       (long)(bvhPrimitives->
                             super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                             )._M_impl.super__Vector_impl_data._M_start));
          pBVar138 = (pointer)boundsBelow[0].pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
          fVar162 = boundsBelow[0].pMax.super_Tuple3<pbrt::Point3,_float>.x;
          auVar111._8_4_ = boundsBelow[0].pMin.super_Tuple3<pbrt::Point3,_float>.z;
          auVar111._12_4_ = boundsBelow[0].pMax.super_Tuple3<pbrt::Point3,_float>.x;
          auVar111._0_4_ = boundsBelow[0].pMin.super_Tuple3<pbrt::Point3,_float>.x;
          auVar111._4_4_ = boundsBelow[0].pMin.super_Tuple3<pbrt::Point3,_float>.y;
          auVar163 = ZEXT1664(auVar111);
          pPVar151 = pPVar151 + 4;
          fVar2 = boundsBelow[0].pMax.super_Tuple3<pbrt::Point3,_float>.z;
          (afStack_484 + (long)iVar148 * 7)[0] =
               boundsBelow[0].pMax.super_Tuple3<pbrt::Point3,_float>.y;
          (afStack_484 + (long)iVar148 * 7)[1] = fVar2;
          pBVar146->pMin = (Point3<float>)auVar111._0_12_;
          (pBVar146->pMax).super_Tuple3<pbrt::Point3,_float>.x = fVar162;
        }
        auVar160 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
        auVar161 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
        pfVar158 = (float *)countBelow;
        lVar152 = -0x118;
        uVar142 = CONCAT62((int6)((ulong)pBVar138 >> 0x10),0x7ff) & 0xffffffff;
        vscatterdps_avx512f(ZEXT864(local_520) + ZEXT864(0) + _DAT_028b2700,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(&boundsBelow[0].pMin.super_Tuple3<pbrt::Point3,_float>.y) +
                            _DAT_028b2700,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(local_520) + ZEXT864(0) + _DAT_028b2740,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(local_520) + ZEXT864(0) + _DAT_028b2780,uVar142,auVar161);
        vscatterdps_avx512f(ZEXT864(local_520) + ZEXT864(0) + _DAT_028b27c0,uVar142,auVar161);
        vscatterdps_avx512f(ZEXT864(local_520) + ZEXT864(0) + _DAT_028b2800,uVar142,auVar161);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + _DAT_028b2700,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + ZEXT864(4) + _DAT_028b2700,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + _DAT_028b2740,uVar142,auVar160);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + _DAT_028b2780,uVar142,auVar161);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + _DAT_028b27c0,uVar142,auVar161);
        vscatterdps_avx512f(ZEXT864(boundsAbove) + _DAT_028b2800,uVar142,auVar161);
        countBelow[0] = (int)children[0]._0_4_;
        lVar153 = 0;
        fVar162 = children[0]._0_4_;
        local_4e4.dim = (int)__comp._M_comp.dim;
        for (; pfVar158 = pfVar158 + 1, lVar152 != 0; lVar152 = lVar152 + 0x1c) {
          fVar162 = (float)((int)fVar162 + *(int *)((long)&local_364 + lVar152));
          *pfVar158 = fVar162;
          Union<float>(&local_328,
                       (Bounds3<float> *)
                       ((long)&boundsBelow[0].pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar153),
                       (Bounds3<float> *)
                       ((long)&local_360.pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar152));
          *(undefined8 *)((long)&boundsBelow[1].pMax.super_Tuple3<pbrt::Point3,_float>.y + lVar153)
               = local_328.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
          *(undefined8 *)((long)&boundsBelow[1].pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar153)
               = local_328.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_;
          *(ulong *)((long)&boundsBelow[1].pMin.super_Tuple3<pbrt::Point3,_float>.z + lVar153) =
               CONCAT44(local_328.pMax.super_Tuple3<pbrt::Point3,_float>.x,
                        local_328.pMin.super_Tuple3<pbrt::Point3,_float>.z);
          lVar153 = lVar153 + 0x18;
        }
        pBVar146 = &local_37c;
        pBVar154 = boundsAbove + 10;
        countAbove[10] = local_364;
        boundsAbove[10].pMax.super_Tuple3<pbrt::Point3,_float>.y =
             local_360.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        boundsAbove[10].pMax.super_Tuple3<pbrt::Point3,_float>.z =
             local_360.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        boundsAbove[10].pMin.super_Tuple3<pbrt::Point3,_float>.x =
             local_360.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        boundsAbove[10].pMin.super_Tuple3<pbrt::Point3,_float>.y =
             local_360.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        boundsAbove[10].pMin.super_Tuple3<pbrt::Point3,_float>.z =
             local_360.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        boundsAbove[10].pMax.super_Tuple3<pbrt::Point3,_float>.x =
             local_360.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar142 = 10;
        while (__comp._M_comp.dim = local_4e4, uVar1 = uVar142 - 1, -1 < (int)uVar1) {
          uVar156 = uVar1 & 0xffffffff;
          countAbove[uVar156] =
               (int)pBVar146[-1].pMax.super_Tuple3<pbrt::Point3,_float>.z + countAbove[uVar142];
          Union<float>(&local_328,pBVar154,pBVar146);
          pBVar146 = (Bounds3<float> *)&pBVar146[-2].pMax.super_Tuple3<pbrt::Point3,_float>.z;
          pBVar154 = pBVar154 + -1;
          boundsAbove[uVar156].pMax.super_Tuple3<pbrt::Point3,_float>.y =
               local_328.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          boundsAbove[uVar156].pMax.super_Tuple3<pbrt::Point3,_float>.z =
               local_328.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          boundsAbove[uVar156].pMin.super_Tuple3<pbrt::Point3,_float>.x =
               local_328.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          boundsAbove[uVar156].pMin.super_Tuple3<pbrt::Point3,_float>.y =
               local_328.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          *(ulong *)&boundsAbove[uVar156].pMin.super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(local_328.pMax.super_Tuple3<pbrt::Point3,_float>.x,
                        local_328.pMin.super_Tuple3<pbrt::Point3,_float>.z);
          uVar142 = uVar1;
        }
        local_4e0 = INFINITY;
        pBVar146 = boundsAbove;
        local_4dc = -1;
        for (lVar153 = 0; lVar153 != 0xb; lVar153 = lVar153 + 1) {
          if ((countBelow[lVar153] != 0) && (iVar148 = countAbove[lVar153], iVar148 != 0)) {
            local_4ac = (float)countBelow[lVar153];
            local_4b0 = Bounds3<float>::SurfaceArea(local_520);
            local_4b4 = (float)iVar148;
            fVar162 = Bounds3<float>::SurfaceArea(pBVar146);
            auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * local_4b4)),ZEXT416((uint)local_4b0)
                                       ,ZEXT416((uint)local_4ac));
            auVar165 = vminss_avx(auVar166,ZEXT416((uint)local_4e0));
            bVar159 = auVar166._0_4_ < local_4e0;
            local_4e0 = auVar165._0_4_;
            if (bVar159) {
              local_4dc = (int)lVar153;
            }
          }
          local_520 = local_520 + 1;
          pBVar146 = pBVar146 + 1;
        }
        fVar162 = Bounds3<float>::SurfaceArea(&local_348);
        if (((int)local_4f8 <= local_4f0->maxPrimsInNode) &&
           ((float)(int)local_4f8 <= local_4e0 / fVar162 + 0.5)) {
          LOCK();
          iVar148 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
          (orderedPrimsOffset->super___atomic_base<int>)._M_i =
               (orderedPrimsOffset->super___atomic_base<int>)._M_i + (int)local_4f8;
          UNLOCK();
          lVar153 = (long)start_local;
          pPVar5 = (orderedPrims->
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pBVar138 = (bvhPrimitives->
                     super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar153;
          pPVar6 = (local_4f0->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar150 = iVar148;
          for (; pBVar136 = (BVHBuildNode *)auStack_4d0._16_8_, iVar145 = (int)local_4f8,
              lVar153 < end_local; lVar153 = lVar153 + 1) {
            psVar127 = &pBVar138->primitiveIndex;
            pBVar138 = pBVar138 + 1;
            pPVar5[iVar150].
            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
            .bits = pPVar6[(int)*psVar127].
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    .bits;
            iVar150 = iVar150 + 1;
          }
          goto LAB_003d8537;
        }
        pBVar138 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_268.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_4d0._8_4_
        ;
        local_268.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (float)auStack_4d0._12_4_;
        local_268.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_4d8._0_4_;
        local_268.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)local_4d8._4_4_;
        local_268.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)auStack_4d0._0_4_
        ;
        local_268.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)auStack_4d0._4_4_
        ;
        local_268.dim = (int)__comp._M_comp.dim;
        local_268.minCostSplitBucket = local_4dc;
        pBVar141 = pBVar138 + lVar147;
        for (pBVar155 = (BVHPrimitive *)((long)&local_508->primitiveIndex + (long)pBVar138);
            pBVar138 = pBVar141, pBVar155 != pBVar141; pBVar155 = pBVar155 + 1) {
          bVar159 = buildRecursive::anon_class_32_3_58f29f95::operator()(&local_268,pBVar155);
          if (!bVar159) {
            do {
              pBVar140 = pBVar141;
              pBVar141 = pBVar140 + -1;
              pBVar138 = pBVar155;
              if (pBVar141 == pBVar155) goto LAB_003d8554;
              bVar159 = buildRecursive::anon_class_32_3_58f29f95::operator()(&local_268,pBVar141);
            } while (!bVar159);
            local_328.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = pBVar155->primitiveIndex;
            uVar35 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar36 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_328.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ =
                 *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uStack_310._0_4_ = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uStack_310._4_4_ = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uStack_308._0_4_ = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uStack_308._4_4_ = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar139 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_300 = (undefined4)uVar139;
            uStack_2fc = (undefined4)((ulong)uVar139 >> 0x20);
            sVar7 = pBVar141->primitiveIndex;
            fVar130 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar131 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar139 = *(undefined8 *)&pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar132 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar133 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar162 = pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar2 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar3 = pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar14 = *(undefined8 *)&pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar128 = pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar129 = pBVar140[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
            (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
            (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
            *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
            (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
            (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
            pBVar155->primitiveIndex = sVar7;
            (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
            (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
            *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
            (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
            (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
            auVar110._4_4_ = local_328.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            auVar110._8_4_ = local_328.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            auVar110._0_4_ = uVar36;
            auVar110._12_8_ = uStack_310;
            auVar110._20_8_ = uStack_308;
            auVar110._28_4_ = uStack_300;
            *(undefined1 (*) [32])&pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 auVar110;
            pBVar141->primitiveIndex = local_328.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_;
            pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar35;
            pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar36;
            *(undefined8 *)&pBVar140[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_328.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
            pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                 (float)(undefined4)uStack_310;
            pBVar140[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_310._4_4_;
            local_328.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar35;
            local_328.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar36;
          }
        }
LAB_003d8554:
        local_4fc = (int)(((long)pBVar138 -
                          (long)(bvhPrimitives->
                                super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0x30);
      }
      goto LAB_003d86b8;
    }
    pBVar138 = (bvhPrimitives->
               super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
               super__Vector_impl_data._M_start;
  }
  local_4fc = iVar145;
  if (iVar145 != iVar148 && iVar148 != iVar150) {
    pBVar140 = pBVar138 + iVar145;
    pBVar155 = (BVHPrimitive *)((long)&local_508->primitiveIndex + (long)pBVar138);
    uVar142 = (ulong)(uint)((int)LZCOUNT((lVar147 * 0x30 - (long)local_508) / 0x30) * 2) ^ 0x7e;
    lVar153 = (ulong)(__comp._M_comp.dim != 1) * 4 + 0x24;
    pBVar141 = pBVar138 + lVar147;
    if (__comp._M_comp.dim == 0) {
      lVar153 = 0x20;
    }
    while (pBVar138 = pBVar141, 0x90 < (long)pBVar138 - (long)pBVar155) {
      bVar159 = uVar142 == 0;
      uVar142 = uVar142 - 1;
      if (bVar159) {
        pBVar141 = pBVar140 + 1;
        lVar152 = ((long)pBVar141 - (long)pBVar155) / 0x30;
        local_508 = pBVar140;
        local_4f8 = pBVar138;
        if (0x5f < (long)pBVar141 - (long)pBVar155) {
          uVar142 = lVar152 - 2U >> 1;
          pBVar157 = pBVar155 + uVar142;
          do {
            uVar115 = pBVar157->primitiveIndex;
            auVar116 = *(undefined1 (*) [12])&(pBVar157->bounds).pMin;
            auVar117 = *(undefined1 (*) [12])&(pBVar157->bounds).pMax;
            __value.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar117;
            __value.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar116;
            __value.primitiveIndex = uVar115;
            __value._32_16_ =
                 SUB3216(*(undefined1 (*) [32])
                          &(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z,0x10);
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                      (pBVar155,uVar142,lVar152,__value,__comp);
            pBVar157 = pBVar157 + -1;
            bVar159 = uVar142 != 0;
            uVar142 = uVar142 - 1;
            pBVar138 = local_4f8;
          } while (bVar159);
        }
        for (; pBVar141 < pBVar138; pBVar141 = pBVar141 + 1) {
          if (*(float *)((long)&pBVar141->primitiveIndex + lVar153) <
              *(float *)((long)&pBVar155->primitiveIndex + lVar153)) {
            uVar76 = (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar77 = (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pfVar158 = &(pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar78 = (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar79 = (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar121 = pBVar141->primitiveIndex;
            auVar122 = *(undefined1 (*) [12])&(pBVar141->bounds).pMin;
            auVar123 = *(undefined1 (*) [12])&(pBVar141->bounds).pMax;
            __value_00.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar123;
            __value_00.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar122;
            __value_00.primitiveIndex = uVar121;
            auVar114 = *(undefined1 (*) [12])pfVar158;
            uVar80 = (pBVar141->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar81 = (pBVar141->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar139 = *(undefined8 *)&(pBVar141->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            afStack_484[5] = (float)uVar139;
            uStack_46c = (undefined4)((ulong)uVar139 >> 0x20);
            children[0]._0_4_ = (float)pBVar141->primitiveIndex;
            children[0]._4_4_ = (float)(pBVar141->primitiveIndex >> 0x20);
            afStack_484[0] = (float)((ulong)*(undefined8 *)pfVar158 >> 0x20);
            sVar7 = pBVar155->primitiveIndex;
            fVar130 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar131 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar132 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar133 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar162 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar2 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar3 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar14 = *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar128 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            fVar129 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
            (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
            (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
            *(undefined8 *)&(pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
            (pBVar141->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
            (pBVar141->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
            pBVar141->primitiveIndex = sVar7;
            (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
            (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
            *(undefined8 *)&(pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
            (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
            (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
            auVar108._12_4_ = uVar79;
            auVar108._0_12_ = auVar114;
            auVar108._16_4_ = uVar80;
            auVar108._20_4_ = uVar81;
            auVar108._24_4_ = afStack_484[5];
            auVar108._28_4_ = uStack_46c;
            __value_00._32_16_ = auVar108._16_16_;
            children[1]._0_4_ = (float)uVar76;
            children[1]._4_4_ = (float)uVar77;
            afStack_484[1] = (float)uVar78;
            afStack_484[2] = (float)uVar79;
            afStack_484[3] = (float)uVar80;
            afStack_484[4] = (float)uVar81;
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                      (pBVar155,0,lVar152,__value_00,__comp);
          }
        }
LAB_003d8667:
        sVar7 = pBVar155->primitiveIndex;
        uVar100 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar101 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar102 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar103 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar104 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
        uVar105 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar14;
        uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
        children[0]._0_4_ = (float)sVar7;
        children[0]._4_4_ = (float)(sVar7 >> 0x20);
        fStack_488 = (float)uVar139;
        afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
        sVar15 = local_508->primitiveIndex;
        fVar130 = (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar131 = (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar132 = (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar133 = (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar162 = (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar16 = *(undefined8 *)&(local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar128 = (local_508->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = (local_508->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar155->primitiveIndex = sVar15;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
        *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
        uVar14 = CONCAT44(uVar104,uVar103);
        (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar101;
        (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
        (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
        (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar102;
        *(undefined8 *)&(local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (local_508->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar105;
        (local_508->centroid).super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
        local_508->primitiveIndex = sVar7;
        (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar100;
        (local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar101;
        *(undefined8 *)&(local_508->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
        (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar102;
        (local_508->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar103;
        children[1]._0_4_ = (float)uVar100;
        children[1]._4_4_ = (float)uVar101;
        afStack_484[1] = (float)uVar102;
        afStack_484[2] = (float)uVar103;
        afStack_484[3] = (float)uVar104;
        afStack_484[4] = (float)uVar105;
        goto LAB_003d86b8;
      }
      fVar162 = *(float *)((long)&pBVar155[1].primitiveIndex + lVar153);
      fVar2 = *(float *)((long)&pBVar138[-1].primitiveIndex + lVar153);
      pBVar141 = pBVar155 + 1;
      pBVar157 = pBVar155 + (ulong)((long)pBVar138 - (long)pBVar155) / 0x60;
      fVar3 = *(float *)((long)&pBVar157->primitiveIndex + lVar153);
      pBVar143 = pBVar138;
      if (fVar3 <= fVar162) {
        if (fVar2 <= fVar162) {
          if (fVar3 < fVar2) goto LAB_003d8096;
          goto LAB_003d80e4;
        }
LAB_003d803f:
        sVar7 = pBVar155->primitiveIndex;
        uVar40 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar41 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar42 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar43 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar44 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
        uVar45 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar14;
        uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
        children[0]._0_4_ = (float)sVar7;
        children[0]._4_4_ = (float)(sVar7 >> 0x20);
        fStack_488 = (float)uVar139;
        afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
        sVar15 = pBVar141->primitiveIndex;
        fVar130 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar131 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar132 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar133 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar162 = pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar16 = *(undefined8 *)&pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar128 = pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
             pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar155->primitiveIndex = sVar15;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
        *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
        uVar14 = CONCAT44(uVar44,uVar43);
        pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar41;
        pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
        pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
        pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42;
        *(undefined8 *)&pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar45;
        pBVar155[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
        pBVar141->primitiveIndex = sVar7;
        pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar40;
        pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar41;
        *(undefined8 *)&pBVar155[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
        pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42;
        pBVar155[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar43;
        children[1]._0_4_ = (float)uVar40;
        children[1]._4_4_ = (float)uVar41;
        afStack_484[1] = (float)uVar42;
        afStack_484[2] = (float)uVar43;
        afStack_484[3] = (float)uVar44;
        afStack_484[4] = (float)uVar45;
      }
      else if (fVar3 < fVar2) {
LAB_003d80e4:
        sVar7 = pBVar155->primitiveIndex;
        uVar52 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar53 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar54 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar55 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
        uVar57 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar14;
        uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
        children[0]._0_4_ = (float)sVar7;
        children[0]._4_4_ = (float)(sVar7 >> 0x20);
        fStack_488 = (float)uVar139;
        afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
        sVar15 = pBVar157->primitiveIndex;
        fVar130 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar131 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar132 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar133 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar162 = (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar16 = *(undefined8 *)&(pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar128 = (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar155->primitiveIndex = sVar15;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
        *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
        uVar14 = CONCAT44(uVar56,uVar55);
        (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar53;
        (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
        (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
        (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar54;
        *(undefined8 *)&(pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar57;
        (pBVar157->centroid).super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
        pBVar157->primitiveIndex = sVar7;
        (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar52;
        (pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar53;
        *(undefined8 *)&(pBVar157->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
        (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar54;
        (pBVar157->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar55;
        children[1]._0_4_ = (float)uVar52;
        children[1]._4_4_ = (float)uVar53;
        afStack_484[1] = (float)uVar54;
        afStack_484[2] = (float)uVar55;
        afStack_484[3] = (float)uVar56;
        afStack_484[4] = (float)uVar57;
      }
      else {
        if (fVar2 <= fVar162) goto LAB_003d803f;
LAB_003d8096:
        sVar7 = pBVar155->primitiveIndex;
        uVar46 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar47 = (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar139 = *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar48 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar49 = (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar50 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.x;
        uVar51 = (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&(pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar14;
        uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
        children[0]._0_4_ = (float)sVar7;
        children[0]._4_4_ = (float)(sVar7 >> 0x20);
        fStack_488 = (float)uVar139;
        afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
        sVar15 = pBVar138[-1].primitiveIndex;
        fVar130 = pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar131 = pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar132 = pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar133 = pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar162 = pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar16 = *(undefined8 *)&pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar128 = pBVar138[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = pBVar138[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
             pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar155->primitiveIndex = sVar15;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
        (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
        *(undefined8 *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
        (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
        uVar14 = CONCAT44(uVar50,uVar49);
        pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar47;
        pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
        pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
        pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar48;
        *(undefined8 *)&pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        pBVar138[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar51;
        pBVar138[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
        pBVar138[-1].primitiveIndex = sVar7;
        pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar46;
        pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar47;
        *(undefined8 *)&pBVar138[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
        pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar48;
        pBVar138[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar49;
        children[1]._0_4_ = (float)uVar46;
        children[1]._4_4_ = (float)uVar47;
        afStack_484[1] = (float)uVar48;
        afStack_484[2] = (float)uVar49;
        afStack_484[3] = (float)uVar50;
        afStack_484[4] = (float)uVar51;
      }
      while( true ) {
        fVar162 = *(float *)((long)&pBVar155->primitiveIndex + lVar153);
        pBVar134 = pBVar141 + -1;
        do {
          pBVar149 = pBVar134;
          pBVar134 = pBVar149 + 1;
        } while (*(float *)((long)&pBVar149[1].primitiveIndex + lVar153) < fVar162);
        pBVar141 = pBVar149 + 2;
        do {
          pBVar144 = pBVar143;
          pBVar143 = pBVar144 + -1;
        } while (fVar162 < *(float *)((long)&pBVar144[-1].primitiveIndex + lVar153));
        if (pBVar143 <= pBVar134) break;
        sVar7 = pBVar134->primitiveIndex;
        uVar58 = pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar59 = pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar139 = *(undefined8 *)&pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar60 = pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar61 = pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar62 = pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
        uVar63 = pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
        afStack_484[5] = (float)uVar14;
        uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
        children[0]._0_4_ = (float)sVar7;
        children[0]._4_4_ = (float)(sVar7 >> 0x20);
        fStack_488 = (float)uVar139;
        afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
        sVar15 = pBVar143->primitiveIndex;
        fVar130 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar131 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar14 = *(undefined8 *)&pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar132 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar133 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar162 = pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        fVar3 = pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar16 = *(undefined8 *)&pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar128 = pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
        fVar129 = pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
        pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar162;
        pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
        pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
        *(undefined8 *)&pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
        pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar128;
        pBVar149[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar129;
        pBVar134->primitiveIndex = sVar15;
        pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar130;
        pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar131;
        *(undefined8 *)&pBVar149[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar132;
        pBVar149[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar133;
        uVar14 = CONCAT44(uVar62,uVar61);
        pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar59;
        pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
        pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
        pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar60;
        *(undefined8 *)&pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
        pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar63;
        pBVar144[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
        pBVar143->primitiveIndex = sVar7;
        pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar58;
        pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar59;
        *(undefined8 *)&pBVar144[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
        pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar60;
        pBVar144[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar61;
        children[1]._0_4_ = (float)uVar58;
        children[1]._4_4_ = (float)uVar59;
        afStack_484[1] = (float)uVar60;
        afStack_484[2] = (float)uVar61;
        afStack_484[3] = (float)uVar62;
        afStack_484[4] = (float)uVar63;
      }
      pBVar141 = pBVar134;
      if (pBVar134 <= pBVar140) {
        pBVar141 = pBVar138;
        pBVar155 = pBVar134;
      }
    }
    pBVar141 = pBVar155;
    if (pBVar155 != pBVar138) {
      while (pBVar140 = pBVar141 + 1, pBVar140 != pBVar138) {
        if (*(float *)((long)&pBVar155->primitiveIndex + lVar153) <=
            *(float *)((long)&pBVar140->primitiveIndex + lVar153)) {
          sVar7 = pBVar140->primitiveIndex;
          uVar70 = pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          uVar71 = pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          uVar139 = *(undefined8 *)&pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          uVar72 = pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          uVar73 = pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          uVar74 = pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
          uVar75 = pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
          uVar14 = *(undefined8 *)&pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
          afStack_484[3] = (float)uVar74;
          afStack_484[4] = (float)uVar75;
          afStack_484[5] = (float)uVar14;
          uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
          children[0]._0_4_ = (float)sVar7;
          children[0]._4_4_ = (float)(sVar7 >> 0x20);
          children[1]._0_4_ = (float)uVar70;
          children[1]._4_4_ = (float)uVar71;
          fStack_488 = (float)uVar139;
          afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
          afStack_484[1] = (float)uVar72;
          afStack_484[2] = (float)uVar73;
          fVar162 = *(float *)((long)children + lVar153);
          for (; fVar162 < *(float *)((long)&pBVar141->primitiveIndex + lVar153);
              pBVar141 = pBVar141 + -1) {
            sVar15 = pBVar141->primitiveIndex;
            fVar2 = (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar3 = (pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar14 = *(undefined8 *)&(pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar128 = (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar129 = (pBVar141->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            *(undefined1 (*) [32])&pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 *(undefined1 (*) [32])&(pBVar141->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pBVar141[1].primitiveIndex = sVar15;
            pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
            pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
            *(undefined8 *)&pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar14;
            pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar128;
            pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar129;
          }
          pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar71;
          pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
          pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
          pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar72;
          *(ulong *)&pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(afStack_484[3],afStack_484[2]);
          pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar75;
          pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
          pBVar141[1].primitiveIndex = sVar7;
          pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar70;
          pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar71;
          *(undefined8 *)&pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar139;
          pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar72;
          pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar73;
          pBVar141 = pBVar140;
        }
        else {
          uVar64 = pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          uVar65 = pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          uVar139 = *(undefined8 *)&pBVar141[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          uVar66 = pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          uVar67 = pBVar141[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          uVar68 = pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
          uVar69 = pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
          uVar14 = *(undefined8 *)&pBVar141[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
          afStack_484[5] = (float)uVar14;
          uStack_46c = (undefined4)((ulong)uVar14 >> 0x20);
          children[0]._0_4_ = (float)pBVar140->primitiveIndex;
          children[0]._4_4_ = (float)(pBVar140->primitiveIndex >> 0x20);
          fStack_488 = (float)uVar139;
          afStack_484[0] = (float)((ulong)uVar139 >> 0x20);
          children[1]._0_4_ = (float)uVar64;
          children[1]._4_4_ = (float)uVar65;
          afStack_484[1] = (float)uVar66;
          afStack_484[2] = (float)uVar67;
          afStack_484[3] = (float)uVar68;
          afStack_484[4] = (float)uVar69;
          memmove(pBVar141 + ((long)pBVar140 - (long)pBVar155) / -0x30 + 2,pBVar155,
                  (long)pBVar140 - (long)pBVar155);
          pBVar155->primitiveIndex = CONCAT44(children[0]._4_4_,children[0]._0_4_);
          (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = children[1]._0_4_;
          (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = children[1]._4_4_;
          *(ulong *)&(pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(afStack_484[0],fStack_488);
          (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = afStack_484[1];
          (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = afStack_484[2];
          (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = children[1]._4_4_;
          (pBVar155->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fStack_488;
          (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = afStack_484[0];
          (pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = afStack_484[1];
          *(ulong *)&(pBVar155->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(afStack_484[3],afStack_484[2]);
          (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.y = afStack_484[4];
          (pBVar155->centroid).super_Tuple3<pbrt::Point3,_float>.z = afStack_484[5];
          pBVar141 = pBVar140;
        }
      }
    }
  }
LAB_003d86b8:
  totalNodes_00 = totalNodes_local;
  threadAllocators_00 = local_4a8;
  this_00 = local_4f0;
  iVar148 = end_local;
  orderedPrimsOffset_00 = orderedPrimsOffset;
  if (end_local - start_local < 0x20001) {
    local_508 = (pointer)CONCAT44(local_508._4_4_,local_4fc);
    local_4e4 = __comp._M_comp.dim;
    pBVar136 = buildRecursive(local_4f0,local_4a8,bvhPrimitives,start_local,local_4fc,
                              totalNodes_local,orderedPrimsOffset,orderedPrims);
    __comp._M_comp.dim = local_4e4;
    children[0]._0_4_ = SUB84(pBVar136,0);
    children[0]._4_4_ = (float)((ulong)pBVar136 >> 0x20);
    c1 = buildRecursive(this_00,threadAllocators_00,bvhPrimitives,(int)local_508,iVar148,
                        totalNodes_00,orderedPrimsOffset_00,orderedPrims);
    children[1]._0_4_ = SUB84(c1,0);
    children[1]._4_4_ = (float)((ulong)c1 >> 0x20);
    this_01 = (BVHBuildNode *)auStack_4d0._16_8_;
  }
  else {
    local_2f8._M_unused._M_object = (void *)0x0;
    local_2f8._8_8_ = 0;
    pcStack_2e8 = (code *)0x0;
    pcStack_2e0 = (code *)0x0;
    local_2f8._M_unused._M_object = operator_new(0x50);
    this_01 = (BVHBuildNode *)auStack_4d0._16_8_;
    *(BVHBuildNode ***)local_2f8._M_unused._0_8_ = children;
    *(BVHAggregate **)((long)local_2f8._M_unused._0_8_ + 8) = local_4f0;
    *(vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
      **)((long)local_2f8._M_unused._0_8_ + 0x10) = local_4a8;
    *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)
     ((long)local_2f8._M_unused._0_8_ + 0x18) = bvhPrimitives;
    *(int **)((long)local_2f8._M_unused._0_8_ + 0x20) = &start_local;
    *(int **)((long)local_2f8._M_unused._0_8_ + 0x28) = &local_4fc;
    *(atomic<int> ***)((long)local_2f8._M_unused._0_8_ + 0x30) = &totalNodes_local;
    *(atomic<int> ***)((long)local_2f8._M_unused._0_8_ + 0x38) = &orderedPrimsOffset;
    *(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> **)
     ((long)local_2f8._M_unused._0_8_ + 0x40) = orderedPrims;
    *(int **)((long)local_2f8._M_unused._0_8_ + 0x48) = &end_local;
    pcStack_2e0 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                  ::_M_invoke;
    pcStack_2e8 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                  ::_M_manager;
    ParallelFor(0,2,(function<void_(long)> *)&local_2f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
    pBVar136 = (BVHBuildNode *)CONCAT44(children[0]._4_4_,children[0]._0_4_);
    c1 = (BVHBuildNode *)CONCAT44(children[1]._4_4_,children[1]._0_4_);
  }
  BVHBuildNode::InitInterior(this_01,(int)__comp._M_comp.dim,pBVar136,c1);
  return this_01;
}

Assistant:

BVHBuildNode *BVHAggregate::buildRecursive(std::vector<Allocator> &threadAllocators,
                                           std::vector<BVHPrimitive> &bvhPrimitives,
                                           int start, int end,
                                           std::atomic<int> *totalNodes,
                                           std::atomic<int> *orderedPrimsOffset,
                                           std::vector<PrimitiveHandle> &orderedPrims) {
    DCHECK_NE(start, end);
    Allocator alloc = threadAllocators[ThreadIndex];
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();
    // Initialize _BVHBuildNode_ for primitive range
    ++*totalNodes;
    // Compute bounds of all primitives in BVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, bvhPrimitives[i].bounds);

    int nPrimitives = end - start;
    if (bounds.SurfaceArea() == 0 || nPrimitives == 1) {
        // Create leaf _BVHBuildNode_
        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
        for (int i = start; i < end; ++i) {
            int index = bvhPrimitives[i].primitiveIndex;
            orderedPrims[firstPrimOffset + i - start] = primitives[index];
        }
        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
        return node;

    } else {
        // Compute bound of primitive centroids, choose split dimension _dim_
        Bounds3f centroidBounds;
        for (int i = start; i < end; ++i)
            centroidBounds = Union(centroidBounds, bvhPrimitives[i].centroid);
        int dim = centroidBounds.MaxDimension();

        // Partition primitives into two sets and build children
        int mid = (start + end) / 2;
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim]) {
            // Create leaf _BVHBuildNode_
            int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
            for (int i = start; i < end; ++i) {
                int index = bvhPrimitives[i].primitiveIndex;
                orderedPrims[firstPrimOffset + i - start] = primitives[index];
            }
            node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
            return node;

        } else {
            // Partition primitives based on _splitMethod_
            switch (splitMethod) {
            case SplitMethod::Middle: {
                // Partition primitives through node's midpoint
                Float pmid = (centroidBounds.pMin[dim] + centroidBounds.pMax[dim]) / 2;
                BVHPrimitive *midPtr =
                    std::partition(&bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                                   [dim, pmid](const BVHPrimitive &pi) {
                                       return pi.centroid[dim] < pmid;
                                   });
                mid = midPtr - &bvhPrimitives[0];
                // For lots of prims with large overlapping bounding boxes, this
                // may fail to partition; in that case don't break and fall through
                // to EqualCounts.
                if (mid != start && mid != end)
                    break;
            }
            case SplitMethod::EqualCounts: {
                // Partition primitives into equally sized subsets
                mid = (start + end) / 2;
                std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                 &bvhPrimitives[end - 1] + 1,
                                 [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                     return a.centroid[dim] < b.centroid[dim];
                                 });

                break;
            }
            case SplitMethod::SAH:
            default: {
                // Partition primitives using approximate SAH
                if (nPrimitives <= 2) {
                    // Partition primitives into equally sized subsets
                    mid = (start + end) / 2;
                    std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                     &bvhPrimitives[end - 1] + 1,
                                     [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                         return a.centroid[dim] < b.centroid[dim];
                                     });

                } else {
                    // Allocate _BVHSplitBucket_ for SAH partition buckets
                    constexpr int nBuckets = 12;
                    BVHSplitBucket buckets[nBuckets];

                    // Initialize _BVHSplitBucket_ for SAH partition buckets
                    for (int i = start; i < end; ++i) {
                        int b = nBuckets *
                                centroidBounds.Offset(bvhPrimitives[i].centroid)[dim];
                        if (b == nBuckets)
                            b = nBuckets - 1;
                        DCHECK_GE(b, 0);
                        DCHECK_LT(b, nBuckets);
                        buckets[b].count++;
                        buckets[b].bounds =
                            Union(buckets[b].bounds, bvhPrimitives[i].bounds);
                    }

                    // Compute costs for splitting after each bucket
                    constexpr int nSplits = nBuckets - 1;
                    int countBelow[nSplits], countAbove[nSplits];
                    Bounds3f boundsBelow[nSplits], boundsAbove[nSplits];
                    // Initialize _countBelow_ and _boundsBelow_ using a forward scan over
                    // splits
                    countBelow[0] = buckets[0].count;
                    boundsBelow[0] = buckets[0].bounds;
                    for (int i = 1; i < nSplits; ++i) {
                        countBelow[i] = countBelow[i - 1] + buckets[i].count;
                        boundsBelow[i] = Union(boundsBelow[i - 1], buckets[i].bounds);
                    }

                    // Initialize _countAbove_ and _boundsAbove_ using a backwards scan
                    // over splits
                    countAbove[nSplits - 1] = buckets[nBuckets - 1].count;
                    boundsAbove[nSplits - 1] = buckets[nBuckets - 1].bounds;
                    for (int i = nSplits - 2; i >= 0; --i) {
                        countAbove[i] = countAbove[i + 1] + buckets[i + 1].count;
                        boundsAbove[i] = Union(boundsAbove[i + 1], buckets[i + 1].bounds);
                    }

                    // Find bucket to split at that minimizes SAH metric
                    int minCostSplitBucket = -1;
                    Float minCost = Infinity;
                    for (int i = 0; i < nSplits; ++i) {
                        // Compute cost for candidate split and update minimum if
                        // necessary
                        if (countBelow[i] == 0 || countAbove[i] == 0)
                            continue;
                        Float cost = (countBelow[i] * boundsBelow[i].SurfaceArea() +
                                      countAbove[i] * boundsAbove[i].SurfaceArea());
                        if (cost < minCost) {
                            minCost = cost;
                            minCostSplitBucket = i;
                        }
                    }
                    // Compute leaf cost and SAH split cost for chosen split
                    Float leafCost = nPrimitives;
                    minCost = 1.f / 2.f + minCost / bounds.SurfaceArea();

                    // Either create leaf or split primitives at selected SAH bucket
                    if (nPrimitives > maxPrimsInNode || minCost < leafCost) {
                        BVHPrimitive *pmid = std::partition(
                            &bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                            [=](const BVHPrimitive &bp) {
                                int b =
                                    nBuckets * centroidBounds.Offset(bp.centroid)[dim];
                                if (b == nBuckets)
                                    b = nBuckets - 1;
                                return b <= minCostSplitBucket;
                            });
                        mid = pmid - &bvhPrimitives[0];
                    } else {
                        // Create leaf _BVHBuildNode_
                        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
                        for (int i = start; i < end; ++i) {
                            int index = bvhPrimitives[i].primitiveIndex;
                            orderedPrims[firstPrimOffset + i - start] = primitives[index];
                        }
                        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
                        return node;
                    }
                }

                break;
            }
            }

            BVHBuildNode *children[2];
            // Recursively build BVHs for _children_
            if (end - start > 128 * 1024) {
                // Recursively build child BVHs in parallel
                ParallelFor(0, 2, [&](int i) {
                    if (i == 0)
                        children[0] =
                            buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                    else
                        children[1] =
                            buildRecursive(threadAllocators, bvhPrimitives, mid, end,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                });

            } else {
                // Recursively build child BVHs sequentially
                children[0] =
                    buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                   totalNodes, orderedPrimsOffset, orderedPrims);
                children[1] =
                    buildRecursive(threadAllocators, bvhPrimitives, mid, end, totalNodes,
                                   orderedPrimsOffset, orderedPrims);
            }

            node->InitInterior(dim, children[0], children[1]);
        }
    }

    return node;
}